

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[7],_int> *
__thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const[7],int>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_char[7],_int>
           *__return_storage_ptr__,v10 *this,char (*args) [7],int *args_1)

{
  int *args_local_1;
  char (*args_local) [7];
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  size_t local_70;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_38;
  size_t local_30;
  
  local_38._0_4_ = *(undefined4 *)*args;
  (__return_storage_ptr__->data_).args_[0].field_0.named_args.data = (named_arg_info<char> *)this;
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = local_70;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_38;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}